

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

void __thiscall cmRST::ProcessLine(cmRST *this,string *line)

{
  string *__return_storage_ptr__;
  bool bVar1;
  byte bVar2;
  int iVar3;
  MarkupType MVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  bool local_1c1;
  byte local_1a1;
  byte local_169;
  allocator<char> local_159;
  string local_158;
  string local_138;
  byte local_111;
  string local_110;
  undefined1 local_f0 [8];
  string file_1;
  string local_b0;
  string local_90;
  byte local_6d;
  string local_60;
  undefined1 local_40 [8];
  string file;
  bool lastLineEndedInColonColon;
  string *line_local;
  cmRST *this_local;
  
  file.field_2._M_local_buf[0xf] = this->LastLineEndedInColonColon & 1;
  this->LastLineEndedInColonColon = false;
  bVar1 = std::operator==(line,"..");
  if (bVar1) {
LAB_0015d7c4:
    Reset(this);
    lVar7 = std::__cxx11::string::find_first_not_of((char *)line,0x814a74);
    MVar4 = MarkupNormal;
    if (lVar7 == -1) {
      MVar4 = MarkupEmpty;
    }
    this->Markup = MVar4;
    bVar1 = cmsys::RegularExpression::find(&this->CMakeDirective,line);
    if (bVar1) {
      NormalLine(this,line);
      return;
    }
    bVar1 = cmsys::RegularExpression::find(&this->CMakeModuleDirective,line);
    if (bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_((string *)local_40,&this->CMakeModuleDirective,1);
      bVar2 = std::__cxx11::string::empty();
      local_6d = 0;
      local_169 = 1;
      if ((bVar2 & 1) == 0) {
        std::__cxx11::string::string((string *)&local_60,(string *)local_40);
        local_6d = 1;
        bVar1 = ProcessInclude(this,&local_60,IncludeModule);
        local_169 = bVar1 ^ 0xff;
      }
      if ((local_6d & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_60);
      }
      if ((local_169 & 1) != 0) {
        NormalLine(this,line);
      }
      std::__cxx11::string::~string((string *)local_40);
      return;
    }
    bVar1 = cmsys::RegularExpression::find(&this->ParsedLiteralDirective,line);
    if (bVar1) {
      this->Directive = DirectiveParsedLiteral;
      cmsys::RegularExpression::match_abi_cxx11_(&local_90,&this->ParsedLiteralDirective,1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MarkupLines,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      return;
    }
    bVar1 = cmsys::RegularExpression::find(&this->CodeBlockDirective,line);
    if (bVar1) {
      this->Directive = DirectiveCodeBlock;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&this->MarkupLines);
      return;
    }
    bVar1 = cmsys::RegularExpression::find(&this->ReplaceDirective,line);
    if (bVar1) {
      this->Directive = DirectiveReplace;
      cmsys::RegularExpression::match_abi_cxx11_(&local_b0,&this->ReplaceDirective,1);
      std::__cxx11::string::operator=((string *)&this->ReplaceName,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      __return_storage_ptr__ = (string *)((long)&file_1.field_2 + 8);
      cmsys::RegularExpression::match_abi_cxx11_(__return_storage_ptr__,&this->ReplaceDirective,2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MarkupLines,__return_storage_ptr__);
      std::__cxx11::string::~string((string *)(file_1.field_2._M_local_buf + 8));
      return;
    }
    bVar1 = cmsys::RegularExpression::find(&this->IncludeDirective,line);
    if (bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_((string *)local_f0,&this->IncludeDirective,1);
      bVar2 = std::__cxx11::string::empty();
      local_111 = 0;
      local_1a1 = 1;
      if ((bVar2 & 1) == 0) {
        std::__cxx11::string::string((string *)&local_110,(string *)local_f0);
        local_111 = 1;
        bVar1 = ProcessInclude(this,&local_110,IncludeNormal);
        local_1a1 = bVar1 ^ 0xff;
      }
      if ((local_111 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_110);
      }
      if ((local_1a1 & 1) != 0) {
        NormalLine(this,line);
      }
      std::__cxx11::string::~string((string *)local_f0);
      return;
    }
    bVar1 = cmsys::RegularExpression::find(&this->TocTreeDirective,line);
    if (!bVar1) {
      bVar1 = cmsys::RegularExpression::find(&this->ProductionListDirective,line);
      if (bVar1) {
        NormalLine(this,line);
        return;
      }
      bVar1 = cmsys::RegularExpression::find(&this->NoteDirective,line);
      if (!bVar1) {
        return;
      }
      NormalLine(this,line);
      return;
    }
    this->Directive = DirectiveTocTree;
    cmsys::RegularExpression::match_abi_cxx11_(&local_138,&this->TocTreeDirective,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MarkupLines,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    return;
  }
  uVar5 = std::__cxx11::string::size();
  if (((2 < uVar5) &&
      (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)line), *pcVar6 == '.')) &&
     (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)line), *pcVar6 == '.')) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)line);
    iVar3 = isspace((int)*pcVar6);
    if (iVar3 != 0) goto LAB_0015d7c4;
  }
  if ((this->Markup == MarkupEmpty) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0)) {
    NormalLine(this,line);
    return;
  }
  if (this->Markup == MarkupNone) {
LAB_0015ddfd:
    if (((file.field_2._M_local_buf[0xf] & 1U) == 0) ||
       (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      NormalLine(this,line);
      uVar5 = std::__cxx11::string::size();
      local_1c1 = false;
      if (1 < uVar5) {
        std::__cxx11::string::size();
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)line);
        local_1c1 = false;
        if (*pcVar6 == ':') {
          pcVar6 = (char *)std::__cxx11::string::back();
          local_1c1 = *pcVar6 == ':';
        }
      }
      this->LastLineEndedInColonColon = local_1c1;
    }
    else {
      this->Markup = MarkupNormal;
      this->Directive = DirectiveLiteralBlock;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&this->MarkupLines);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
      OutputLine(this,&local_158,false);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
    }
  }
  else {
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)line);
      iVar3 = isspace((int)*pcVar6);
      if (iVar3 == 0) goto LAB_0015ddfd;
    }
    this->Markup = MarkupNormal;
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->MarkupLines);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MarkupLines,line);
    }
  }
  return;
}

Assistant:

void cmRST::ProcessLine(std::string const& line)
{
  bool lastLineEndedInColonColon = this->LastLineEndedInColonColon;
  this->LastLineEndedInColonColon = false;

  // A line starting in .. is an explicit markup start.
  if (line == ".." ||
      (line.size() >= 3 && line[0] == '.' && line[1] == '.' &&
       isspace(line[2]))) {
    this->Reset();
    this->Markup =
      (line.find_first_not_of(" \t", 2) == std::string::npos ? MarkupEmpty
                                                             : MarkupNormal);
    if (this->CMakeDirective.find(line)) {
      // Output cmake domain directives and their content normally.
      this->NormalLine(line);
    } else if (this->CMakeModuleDirective.find(line)) {
      // Process cmake-module directive: scan .cmake file comments.
      std::string file = this->CMakeModuleDirective.match(1);
      if (file.empty() || !this->ProcessInclude(file, IncludeModule)) {
        this->NormalLine(line);
      }
    } else if (this->ParsedLiteralDirective.find(line)) {
      // Record the literal lines to output after whole block.
      this->Directive = DirectiveParsedLiteral;
      this->MarkupLines.push_back(this->ParsedLiteralDirective.match(1));
    } else if (this->CodeBlockDirective.find(line)) {
      // Record the literal lines to output after whole block.
      // Ignore the language spec and record the opening line as blank.
      this->Directive = DirectiveCodeBlock;
      this->MarkupLines.emplace_back();
    } else if (this->ReplaceDirective.find(line)) {
      // Record the replace directive content.
      this->Directive = DirectiveReplace;
      this->ReplaceName = this->ReplaceDirective.match(1);
      this->MarkupLines.push_back(this->ReplaceDirective.match(2));
    } else if (this->IncludeDirective.find(line)) {
      // Process the include directive or output the directive and its
      // content normally if it fails.
      std::string file = this->IncludeDirective.match(1);
      if (file.empty() || !this->ProcessInclude(file, IncludeNormal)) {
        this->NormalLine(line);
      }
    } else if (this->TocTreeDirective.find(line)) {
      // Record the toctree entries to process after whole block.
      this->Directive = DirectiveTocTree;
      this->MarkupLines.push_back(this->TocTreeDirective.match(1));
    } else if (this->ProductionListDirective.find(line)) {
      // Output productionlist directives and their content normally.
      this->NormalLine(line);
    } else if (this->NoteDirective.find(line)) {
      // Output note directives and their content normally.
      this->NormalLine(line);
    }
  }
  // An explicit markup start followed nothing but whitespace and a
  // blank line does not consume any indented text following.
  else if (this->Markup == MarkupEmpty && line.empty()) {
    this->NormalLine(line);
  }
  // Indented lines following an explicit markup start are explicit markup.
  else if (this->Markup && (line.empty() || isspace(line[0]))) {
    this->Markup = MarkupNormal;
    // Record markup lines if the start line was recorded.
    if (!this->MarkupLines.empty()) {
      this->MarkupLines.push_back(line);
    }
  }
  // A blank line following a paragraph ending in "::" starts a literal block.
  else if (lastLineEndedInColonColon && line.empty()) {
    // Record the literal lines to output after whole block.
    this->Markup = MarkupNormal;
    this->Directive = DirectiveLiteralBlock;
    this->MarkupLines.emplace_back();
    this->OutputLine("", false);
  }
  // Print non-markup lines.
  else {
    this->NormalLine(line);
    this->LastLineEndedInColonColon =
      (line.size() >= 2 && line[line.size() - 2] == ':' && line.back() == ':');
  }
}